

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph<std::pair<double,_double>_>::tarjan
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,Graph<std::pair<double,_double>_> *this,int id_src)

{
  Vertex<std::pair<double,_double>_> *pVVar1;
  bool bVar2;
  reference ppVVar3;
  Vertex<std::pair<double,_double>_> *vertex_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  *__range1_1;
  undefined1 local_98 [8];
  stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
  st;
  int index;
  Vertex<std::pair<double,_double>_> *vertex;
  iterator __end0;
  iterator __begin0;
  vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  *__range1;
  int id_src_local;
  Graph<std::pair<double,_double>_> *this_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *scc;
  
  __end0 = std::
           vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
           ::begin(&this->vertexSet);
  vertex = (Vertex<std::pair<double,_double>_> *)
           std::
           vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
           ::end(&this->vertexSet);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
                                *)&vertex);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
              ::operator*(&__end0);
    pVVar1 = *ppVVar3;
    pVVar1->index = -1;
    pVVar1->low = -1;
    pVVar1->onStack = false;
    __gnu_cxx::
    __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
    ::operator++(&__end0);
  }
  st.c.
  super__Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  st.c.
  super__Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
  std::
  stack<Vertex<std::pair<double,double>>*,std::deque<Vertex<std::pair<double,double>>*,std::allocator<Vertex<std::pair<double,double>>*>>>
  ::
  stack<std::deque<Vertex<std::pair<double,double>>*,std::allocator<Vertex<std::pair<double,double>>*>>,void>
            ((stack<Vertex<std::pair<double,double>>*,std::deque<Vertex<std::pair<double,double>>*,std::allocator<Vertex<std::pair<double,double>>*>>>
              *)local_98);
  __end0_1 = std::
             vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
             ::begin(&this->vertexSet);
  vertex_1 = (Vertex<std::pair<double,_double>_> *)
             std::
             vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
             ::end(&this->vertexSet);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
                        *)&vertex_1);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
              ::operator*(&__end0_1);
    if ((*ppVVar3)->index == -1) {
      strongconnect(this,*ppVVar3,
                    (int *)&st.c.
                            super__Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node,
                    (stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
                     *)local_98,__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<Vertex<std::pair<double,_double>_>_**,_std::vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
    ::operator++(&__end0_1);
  }
  st.c.
  super__Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
  std::
  stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
  ::~stack((stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
            *)local_98);
  if ((st.c.
       super__Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<int>> Graph<T>::tarjan(const int id_src) {
    for (Vertex<T>* vertex : vertexSet) {
        vertex->index = -1;
        vertex->low = -1;
        vertex->onStack = false;
    }

    vector<vector<int>> scc;

    int index = 0;
    stack<Vertex<T>*> st;

    for (Vertex<T>* vertex : vertexSet) {
        if (vertex->index == -1) {
            strongconnect(vertex, index, st, scc);
        }
    }

    return scc;
}